

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValuesForShaderStage
          (FunctionalTest16 *this,_shader_stage *shader_stage,
          _subroutine_uniform_value_verification *verification)

{
  ostringstream *poVar1;
  GLuint GVar2;
  GLuint GVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  GLenum shader_stage_glenum;
  GLenum shader_stage_glenum_00;
  GLenum shader_stage_glenum_01;
  GLuint result_values [4];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  FunctionalTest16 *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar5;
  
  local_1d8 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  local_1e8 = 0;
  uStack_1e0 = 0;
  (**(code **)(lVar5 + 0xb50))(shader_stage->gl_stage,shader_stage->subroutine1_uniform_location);
  (**(code **)(lVar5 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine2_uniform_location,(long)&local_1e8 + 4)
  ;
  (**(code **)(lVar5 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine3_uniform_location,&uStack_1e0);
  (**(code **)(lVar5 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine4_uniform_location,(long)&uStack_1e0 + 4
            );
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"glGetUniformSubroutineuiv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x226d);
  if (*verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES) {
    if (((((GLuint)local_1e8 == shader_stage->default_subroutine1_value) &&
         (local_1e8._4_4_ == shader_stage->default_subroutine2_value)) &&
        ((GLuint)uStack_1e0 == shader_stage->default_subroutine3_value)) &&
       (uStack_1e0._4_4_ == shader_stage->default_subroutine4_value)) {
      return;
    }
    local_1b0 = (undefined1  [8])
                ((local_1d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,
                    "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. Shader stage:[");
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_1d0,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_00);
    std::operator<<(&local_1a8,(string *)&local_1d0);
    std::operator<<(&local_1a8,"], expected data:[");
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&shader_stage->default_subroutine1_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine2_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine3_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine4_value);
    poVar1 = &pMVar6->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"], found data:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (*verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES) {
      GVar2 = shader_stage->subroutine1_uniform_location;
      GVar3 = shader_stage->subroutine2_uniform_location;
      if (((GLuint)local_1e8 == GVar3 || (GLuint)local_1e8 == GVar2) &&
         (local_1e8._4_4_ == GVar3 || local_1e8._4_4_ == GVar2)) {
        GVar2 = shader_stage->subroutine3_uniform_location;
        GVar3 = shader_stage->subroutine4_uniform_location;
        if (((GLuint)uStack_1e0 == GVar3 || (GLuint)uStack_1e0 == GVar2) &&
           (uStack_1e0._4_4_ == GVar3 || uStack_1e0._4_4_ == GVar2)) {
          return;
        }
      }
      local_1b0 = (undefined1  [8])
                  ((local_1d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,
                      "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. Shader stage:[");
      Utils::getShaderStageStringFromGLEnum_abi_cxx11_
                (&local_1d0,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum);
      std::operator<<(&local_1a8,(string *)&local_1d0);
      std::operator<<(&local_1a8,"], expected data:[");
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,&shader_stage->subroutine1_uniform_location);
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>," OR ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->subroutine2_uniform_location);
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>," x 2, ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->subroutine3_uniform_location);
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>," OR ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->subroutine4_uniform_location);
      poVar1 = &pMVar6->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " x 2], found data:[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1d0);
      goto LAB_00a251a6;
    }
    if ((((GLuint)local_1e8 != shader_stage->default_subroutine1_value) &&
        (local_1e8._4_4_ != shader_stage->default_subroutine2_value)) &&
       (((GLuint)uStack_1e0 != shader_stage->default_subroutine3_value &&
        (uStack_1e0._4_4_ != shader_stage->default_subroutine4_value)))) {
      return;
    }
    local_1b0 = (undefined1  [8])
                ((local_1d8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,
                    "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. Shader stage:["
                   );
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_1d0,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_01);
    std::operator<<(&local_1a8,(string *)&local_1d0);
    std::operator<<(&local_1a8,"], expected data:![");
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&shader_stage->default_subroutine1_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine2_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine3_value);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&shader_stage->default_subroutine4_value);
    poVar1 = &pMVar6->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"], found data:[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::string::~string((string *)&local_1d0);
LAB_00a251a6:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  local_1d8->m_has_test_passed = false;
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValuesForShaderStage(
	const _shader_stage& shader_stage, const _subroutine_uniform_value_verification& verification)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  result_values[4] = { 0 };

	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine1_uniform_location, result_values + 0);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine2_uniform_location, result_values + 1);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine3_uniform_location, result_values + 2);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine4_uniform_location, result_values + 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformSubroutineuiv() call(s) failed.");

	if (verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES)
	{
		if (!((result_values[0] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[0] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[1] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[1] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[2] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[2] == (GLuint)shader_stage.subroutine4_uniform_location) &&
			  (result_values[3] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[3] == (GLuint)shader_stage.subroutine4_uniform_location)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. "
														   "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.subroutine1_uniform_location << " OR "
							   << shader_stage.subroutine2_uniform_location << " x 2, "
							   << shader_stage.subroutine3_uniform_location << " OR "
							   << shader_stage.subroutine4_uniform_location << " x 2], "
																			   "found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else if (verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES)
	{
		if (result_values[0] != shader_stage.default_subroutine1_value ||
			result_values[1] != shader_stage.default_subroutine2_value ||
			result_values[2] != shader_stage.default_subroutine3_value ||
			result_values[3] != shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else
	{
		DE_ASSERT(verification == SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);

		if (result_values[0] == shader_stage.default_subroutine1_value ||
			result_values[1] == shader_stage.default_subroutine2_value ||
			result_values[2] == shader_stage.default_subroutine3_value ||
			result_values[3] == shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:!["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
}